

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ManagedStatic.h
# Opt level: O1

void llvm::object_deleter<llvm::cl::SubCommand>::call(void *Ptr)

{
  if (Ptr != (void *)0x0) {
    StringMap<llvm::cl::Option_*,_llvm::MallocAllocator>::~StringMap
              ((StringMap<llvm::cl::Option_*,_llvm::MallocAllocator> *)((long)Ptr + 0x80));
    if (*(void **)((long)Ptr + 0x50) != (void *)((long)Ptr + 0x60)) {
      free(*(void **)((long)Ptr + 0x50));
    }
    if (*(void **)((long)Ptr + 0x20) != (void *)((long)Ptr + 0x30)) {
      free(*(void **)((long)Ptr + 0x20));
    }
    operator_delete(Ptr,0xa8);
    return;
  }
  return;
}

Assistant:

static void call(void *Ptr) { delete (T *)Ptr; }